

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

GraphPath * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
valueImpl<QtGraphicsAnchorLayout::AnchorVertex*>
          (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *this
          ,AnchorVertex **key)

{
  MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *pMVar1;
  Chain *pCVar2;
  
  if (*(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
        **)this !=
      (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
       *)0x0) {
    pMVar1 = QHashPrivate::
             Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
             ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                       (*(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
                          **)this,key);
    if (pMVar1 == (MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                   *)0x0) {
      pCVar2 = (Chain *)0x0;
    }
    else {
      pCVar2 = pMVar1->value;
    }
    return &pCVar2->value;
  }
  return (GraphPath *)0x0;
}

Assistant:

T *valueImpl(const K &key) const noexcept
    {
        if (d) {
            Node *n = d->findNode(key);
            if (n) {
                Q_ASSERT(n->value);
                return &n->value->value;
            }
        }
        return nullptr;
    }